

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O2

int wipe_CalcBurn(BYTE *burnarray,int width,int height,int density)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  BYTE *pBVar17;
  uint uVar18;
  
  iVar2 = height * width;
  iVar3 = density / 3 + wipe_CalcBurn::voop;
  uVar18 = width - 1;
  uVar14 = 0;
  uVar8 = wipe_CalcBurn::voop;
  if (0 < (int)((long)density / 8)) {
    uVar14 = (long)density / 8 & 0xffffffff;
  }
  while (wipe_CalcBurn::voop = iVar3, iVar3 = (int)uVar14, uVar14 = (ulong)(iVar3 - 1), iVar3 != 0)
  {
    uVar16 = uVar8 & uVar18;
    uVar4 = FRandom::operator()(&M_Random);
    bVar1 = burnarray[(ulong)uVar16 + (long)iVar2];
    uVar5 = FRandom::operator()(&M_Random);
    uVar4 = (uVar5 & 0x1f) + (uVar4 >> 3) + (uVar4 & 0xf) + (uint)bVar1 + 4;
    if (0xfe < uVar4) {
      uVar4 = 0xff;
    }
    burnarray[(ulong)((uVar16 + (width * 3) / 2 & uVar18) + width * 2) + (long)iVar2] = (BYTE)uVar4;
    burnarray[(ulong)uVar16 + (long)iVar2] = (BYTE)uVar4;
    uVar8 = uVar8 + 1;
    iVar3 = wipe_CalcBurn::voop;
  }
  lVar6 = (long)(width * 2);
  lVar7 = (long)width;
  pBVar9 = burnarray + (long)(width << 2) + 1;
  pBVar10 = burnarray + lVar7 + 1;
  pBVar11 = burnarray + ((lVar6 + 2) - lVar7);
  pBVar12 = burnarray + lVar6 + 2;
  pBVar17 = burnarray;
  for (iVar3 = 0; iVar3 <= height; iVar3 = iVar3 + 2) {
    bVar1 = pBVar17[width << 2];
    uVar8 = (uint)pBVar17[lVar6 + 1] + (uint)pBVar17[lVar6] + (uint)(pBVar17 + lVar6)[lVar7 + -1] +
            (uint)bVar1;
    iVar13 = ((uVar8 >> 2) - 1) + (uint)(uVar8 < 8);
    *pBVar17 = (BYTE)iVar13;
    pBVar17[lVar7] = (BYTE)(iVar13 + (uint)bVar1 >> 1);
    for (lVar15 = 0; (int)lVar15 + 1 < (int)uVar18; lVar15 = lVar15 + 1) {
      bVar1 = pBVar9[lVar15];
      uVar8 = (uint)pBVar12[lVar15 + -2] + (uint)pBVar12[lVar15 + -1] +
              (uint)pBVar12[lVar15] + (uint)bVar1;
      iVar13 = ((uVar8 >> 2) - 1) + (uint)(uVar8 < 8);
      pBVar17[lVar15 + 1] = (BYTE)iVar13;
      pBVar10[lVar15] = (BYTE)(iVar13 + (uint)bVar1 >> 1);
    }
    bVar1 = pBVar9[lVar15];
    uVar8 = (uint)pBVar12[lVar15 + -2] + (uint)pBVar12[lVar15 + -1] +
            (uint)pBVar11[lVar15] + (uint)bVar1;
    iVar13 = ((uVar8 >> 2) - 1) + (uint)(uVar8 < 8);
    pBVar17[lVar15 + 1] = (BYTE)iVar13;
    pBVar10[lVar15] = (BYTE)(iVar13 + (uint)bVar1 >> 1);
    pBVar9 = pBVar9 + lVar6;
    pBVar10 = pBVar10 + lVar6;
    pBVar11 = pBVar11 + lVar6;
    pBVar12 = pBVar12 + lVar6;
    pBVar17 = pBVar17 + lVar6;
  }
  iVar3 = density + 10;
  if (width * 7 <= density + 10) {
    iVar3 = width * 7;
  }
  for (lVar6 = 0; (iVar13 = -1, iVar2 != (int)lVar6 && (iVar13 = iVar3, 0x7d < burnarray[lVar6]));
      lVar6 = lVar6 + 1) {
  }
  return iVar13;
}

Assistant:

int wipe_CalcBurn (BYTE *burnarray, int width, int height, int density)
{
	// This is a modified version of the fire that was once used
	// on the player setup menu.
	static int voop;

	int a, b;
	BYTE *from;

	// generator
	from = &burnarray[width * height];
	b = voop;
	voop += density / 3;
	for (a = 0; a < density/8; a++)
	{
		unsigned int offs = (a+b) & (width - 1);
		unsigned int v = M_Random();
		v = MIN(from[offs] + 4 + (v & 15) + (v >> 3) + (M_Random() & 31), 255u);
		from[offs] = from[width*2 + ((offs + width*3/2) & (width - 1))] = v;
	}

	density = MIN(density + 10, width * 7);

	from = burnarray;
	for (b = 0; b <= height; b += 2)
	{
		BYTE *pixel = from;

		// special case: first pixel on line
		BYTE *p = pixel + (width << 1);
		unsigned int top = *p + *(p + width - 1) + *(p + 1);
		unsigned int bottom = *(pixel + (width << 2));
		unsigned int c1 = (top + bottom) >> 2;
		if (c1 > 1) c1--;
		*pixel = c1;
		*(pixel + width) = (c1 + bottom) >> 1;
		pixel++;

		// main line loop
		for (a = 1; a < width-1; a++)
		{
			// sum top pixels
			p = pixel + (width << 1);
			top = *p + *(p - 1) + *(p + 1);

			// bottom pixel
			bottom = *(pixel + (width << 2));

			// combine pixels
			c1 = (top + bottom) >> 2;
			if (c1 > 1) c1--;

			// store pixels
			*pixel = c1;
			*(pixel + width) = (c1 + bottom) >> 1;		// interpolate

			// next pixel
			pixel++;
		}

		// special case: last pixel on line
		p = pixel + (width << 1);
		top = *p + *(p - 1) + *(p - width + 1);
		bottom = *(pixel + (width << 2));
		c1 = (top + bottom) >> 2;
		if (c1 > 1) c1--;
		*pixel = c1;
		*(pixel + width) = (c1 + bottom) >> 1;

		// next line
		from += width << 1;
	}

	// Check for done-ness. (Every pixel with level 126 or higher counts as done.)
	for (a = width * height, from = burnarray; a != 0; --a, ++from)
	{
		if (*from < 126)
		{
			return density;
		}
	}
	return -1;
}